

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O2

void __thiscall
duckdb::MergeSorter::MergeData
          (MergeSorter *this,SortedData *result_data,SortedData *l_data,SortedData *r_data,
          idx_t *count,bool *left_smaller,idx_t *next_entry_sizes,bool reset_indices)

{
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_00;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var1;
  pointer puVar2;
  pointer puVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  bool *pbVar8;
  type this_01;
  type this_02;
  reference pvVar9;
  data_ptr_t pdVar10;
  type pSVar11;
  pointer pRVar12;
  idx_t iVar13;
  pointer pSVar14;
  data_ptr_t *ppdVar15;
  optional_ptr<duckdb::FileBuffer,_true> *poVar16;
  FileBuffer *pFVar17;
  idx_t *piVar18;
  FileBuffer *pFVar19;
  idx_t new_capacity;
  element_type *peVar20;
  ulong uVar21;
  idx_t iVar22;
  int iVar23;
  FileBuffer **source_heap_ptr;
  ulong uVar24;
  ulong uVar25;
  idx_t iVar26;
  SortedData *sd;
  RowDataBlock *pRVar27;
  FileBuffer *pFVar28;
  undefined1 local_1b8 [24];
  SortedData *local_1a0;
  ulong *local_198;
  RowDataBlock *local_190;
  SortedData *local_188;
  idx_t *local_180;
  idx_t *local_178;
  idx_t copied;
  element_type *local_168;
  RowDataBlock *local_160;
  data_ptr_t r_ptr;
  data_ptr_t l_ptr;
  bool *local_148;
  optional_ptr<duckdb::FileBuffer,_true> local_140;
  idx_t row_width;
  idx_t local_130;
  idx_t local_128;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_120;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_118;
  FileBuffer *local_110;
  idx_t local_108;
  type local_100;
  FileBuffer *local_f8;
  SortedData *local_f0;
  idx_t copied_copy;
  FileBuffer *local_e0;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_d8;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_d0;
  idx_t local_c8;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_c0;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_b8;
  long local_b0;
  long local_a8;
  RowLayout *local_a0;
  data_ptr_t result_data_ptr_copy;
  idx_t r_idx_copy;
  idx_t l_idx_copy;
  BufferHandle result_heap_handle;
  BufferHandle result_data_handle;
  
  local_d0 = &this->left;
  local_198 = count;
  local_188 = l_data;
  local_148 = left_smaller;
  local_f0 = r_data;
  this_01 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(local_d0);
  this_00 = &this->right;
  this_02 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(this_00);
  iVar4 = this_01->block_idx;
  iVar5 = this_01->entry_idx;
  iVar6 = this_02->block_idx;
  iVar7 = this_02->entry_idx;
  iVar22 = (result_data->layout).row_width;
  local_130 = (result_data->layout).heap_pointer_offset;
  local_1a0 = result_data;
  row_width = iVar22;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&result_data->data_blocks);
  _Var1._M_head_impl =
       (pvVar9->super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
       _M_t.super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  (*this->buffer_manager->_vptr_BufferManager[7])
            (&result_data_handle,this->buffer_manager,_Var1._M_head_impl);
  pdVar10 = BufferHandle::Ptr(&result_data_handle);
  local_168 = (element_type *)(pdVar10 + (_Var1._M_head_impl)->count * iVar22);
  pSVar11 = (type)&result_heap_handle;
  local_160 = _Var1._M_head_impl;
  local_c8 = iVar22;
  BufferHandle::BufferHandle((BufferHandle *)pSVar11);
  local_d8 = this_00;
  if (((local_1a0->layout).all_constant == false) && (this->state->external == true)) {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::back(&local_1a0->heap_blocks);
    local_190 = (pvVar9->
                super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
                _M_t.
                super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
                .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
    (*this->buffer_manager->_vptr_BufferManager[7])(local_1b8);
    pSVar11 = (type)&result_heap_handle;
    BufferHandle::operator=((BufferHandle *)pSVar11,(BufferHandle *)local_1b8);
    BufferHandle::~BufferHandle((BufferHandle *)local_1b8);
    pdVar10 = BufferHandle::Ptr((BufferHandle *)pSVar11);
    local_100 = (type)(pdVar10 + local_190->byte_offset);
  }
  else {
    local_190 = (RowDataBlock *)0x0;
  }
  local_178 = &this_01->entry_idx;
  local_180 = &this_02->entry_idx;
  copied = 0;
  local_a0 = &local_1a0->layout;
  local_118 = &local_188->data_blocks;
  local_b8 = &local_188->heap_blocks;
  local_120 = &local_f0->data_blocks;
  local_c0 = &local_f0->heap_blocks;
  sd = local_f0;
  do {
    while( true ) {
      while( true ) {
        if (*local_198 <= copied) {
          if (reset_indices) {
            pSVar14 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                      ::operator->(local_d0);
            pSVar14->block_idx = iVar4;
            pSVar14->entry_idx = iVar5;
            pSVar14 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                      ::operator->(local_d8);
            pSVar14->block_idx = iVar6;
            pSVar14->entry_idx = iVar7;
          }
          BufferHandle::~BufferHandle(&result_heap_handle);
          BufferHandle::~BufferHandle(&result_data_handle);
          return;
        }
        local_128 = copied;
        if (this_01->block_idx <
            (ulong)((long)(local_188->data_blocks).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_188->data_blocks).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          iVar22 = *local_178;
          pSVar11 = (type)vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          ::get<true>(local_118,this_01->block_idx);
          pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                  *)pSVar11);
          if (iVar22 == pRVar12->count) {
            local_1b8._0_8_ = (element_type *)0x0;
            local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                     ::get<true>(local_118,this_01->block_idx);
            pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      ::operator->(pvVar9);
            shared_ptr<duckdb::BlockHandle,_true>::operator=
                      (&pRVar12->block,(shared_ptr<duckdb::BlockHandle,_true> *)local_1b8);
            pSVar11 = (type)(local_1b8 + 8);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pSVar11);
            if (((local_1a0->layout).all_constant == false) && (this->state->external == true)) {
              local_1b8._0_8_ = (element_type *)0x0;
              local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                       ::get<true>(local_b8,this_01->block_idx);
              pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                        ::operator->(pvVar9);
              shared_ptr<duckdb::BlockHandle,_true>::operator=
                        (&pRVar12->block,(shared_ptr<duckdb::BlockHandle,_true> *)local_1b8);
              pSVar11 = (type)(local_1b8 + 8);
              ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pSVar11);
            }
            this_01->block_idx = this_01->block_idx + 1;
            this_01->entry_idx = 0;
          }
        }
        uVar25 = this_02->block_idx;
        if (uVar25 < (ulong)((long)(sd->data_blocks).
                                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(sd->data_blocks).
                                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          iVar22 = *local_180;
          pSVar11 = (type)vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          ::get<true>(local_120,uVar25);
          pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                  *)pSVar11);
          uVar25 = this_02->block_idx;
          if (iVar22 == pRVar12->count) {
            local_1b8._0_8_ = (element_type *)0x0;
            local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                     ::get<true>(local_120,uVar25);
            pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      ::operator->(pvVar9);
            shared_ptr<duckdb::BlockHandle,_true>::operator=
                      (&pRVar12->block,(shared_ptr<duckdb::BlockHandle,_true> *)local_1b8);
            pSVar11 = (type)(local_1b8 + 8);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pSVar11);
            if (((local_1a0->layout).all_constant == false) && (this->state->external == true)) {
              local_1b8._0_8_ = (element_type *)0x0;
              local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              pvVar9 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                       ::get<true>(local_c0,this_02->block_idx);
              pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                        ::operator->(pvVar9);
              shared_ptr<duckdb::BlockHandle,_true>::operator=
                        (&pRVar12->block,(shared_ptr<duckdb::BlockHandle,_true> *)local_1b8);
              pSVar11 = (type)(local_1b8 + 8);
              ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pSVar11);
            }
            uVar25 = this_02->block_idx + 1;
            this_02->block_idx = uVar25;
            this_02->entry_idx = 0;
          }
        }
        iVar22 = this_01->block_idx;
        iVar26 = (long)(local_188->data_blocks).
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_188->data_blocks).
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        puVar2 = (sd->data_blocks).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar3 = (sd->data_blocks).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar22 != iVar26) {
          SBScanState::PinData(this_01,local_188);
          pSVar11 = this_01;
          l_ptr = SBScanState::DataPtr(this_01,local_188);
        }
        uVar21 = (long)puVar2 - (long)puVar3 >> 3;
        if (uVar25 != uVar21) {
          SBScanState::PinData(this_02,sd);
          pSVar11 = this_02;
          r_ptr = SBScanState::DataPtr(this_02,sd);
        }
        if (iVar22 == iVar26) {
          local_1b8._0_8_ = (element_type *)0x0;
        }
        else {
          pSVar11 = (type)vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          ::get<true>(local_118,this_01->block_idx);
          pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                  *)pSVar11);
          local_1b8._0_8_ = pRVar12->count;
        }
        if (uVar25 == uVar21) {
          local_140.ptr = (FileBuffer *)0x0;
        }
        else {
          pSVar11 = (type)vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          ::get<true>(local_120,this_02->block_idx);
          pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                  *)pSVar11);
          local_140.ptr = (FileBuffer *)pRVar12->count;
        }
        if (((local_1a0->layout).all_constant == false) && (this->state->external != false)) break;
        if ((iVar22 == iVar26) || (uVar25 == uVar21)) {
          if (uVar25 == uVar21) {
            ppdVar15 = &l_ptr;
            poVar16 = (optional_ptr<duckdb::FileBuffer,_true> *)local_1b8;
            piVar18 = local_178;
          }
          else {
            ppdVar15 = &r_ptr;
            poVar16 = &local_140;
            piVar18 = local_180;
          }
          FlushRows((MergeSorter *)pSVar11,ppdVar15,piVar18,(idx_t *)poVar16,local_160,
                    (data_ptr_t *)&local_168,&row_width,&copied,local_198);
        }
        else {
          MergeRows((MergeSorter *)pSVar11,&l_ptr,local_178,(idx_t *)local_1b8,&r_ptr,local_180,
                    (idx_t *)&local_140,local_160,(data_ptr_t *)&local_168,&row_width,local_148,
                    &copied,local_198);
        }
      }
      if (iVar22 != iVar26) {
        pdVar10 = SBScanState::BaseHeapPtr(this_01,local_188);
        local_f8 = (FileBuffer *)(pdVar10 + *(long *)(l_ptr + local_130));
      }
      poVar16 = (optional_ptr<duckdb::FileBuffer,_true> *)local_1b8;
      ppdVar15 = &l_ptr;
      source_heap_ptr = &local_f8;
      piVar18 = local_178;
      if (uVar25 != uVar21) break;
LAB_016a7c1d:
      pSVar11 = (type)this;
      FlushBlobs(this,local_a0,(idx_t *)poVar16,ppdVar15,piVar18,(data_ptr_t *)source_heap_ptr,
                 local_160,(data_ptr_t *)&local_168,local_190,&result_heap_handle,
                 (data_ptr_t *)&local_100,&copied,local_198);
    }
    pSVar11 = this_02;
    pdVar10 = SBScanState::BaseHeapPtr(this_02,sd);
    iVar13 = local_128;
    peVar20 = local_168;
    pFVar28 = (FileBuffer *)(pdVar10 + *(long *)(r_ptr + local_130));
    poVar16 = &local_140;
    ppdVar15 = &r_ptr;
    source_heap_ptr = &local_e0;
    piVar18 = local_180;
    local_e0 = pFVar28;
    if (iVar22 == iVar26) goto LAB_016a7c1d;
    l_idx_copy = *local_178;
    r_idx_copy = *local_180;
    result_data_ptr_copy = (data_ptr_t)local_168;
    copied_copy = local_128;
    MergeRows((MergeSorter *)pSVar11,&l_ptr,&l_idx_copy,(idx_t *)local_1b8,&r_ptr,&r_idx_copy,
              (idx_t *)&local_140,local_160,&result_data_ptr_copy,&row_width,local_148,&copied_copy,
              local_198);
    pRVar27 = local_190;
    local_108 = copied_copy;
    local_a8 = copied_copy - iVar13;
    local_110 = local_f8;
    local_b0 = 0;
    pFVar17 = pFVar28;
    pFVar19 = local_f8;
    for (; copied_copy != iVar13; iVar13 = iVar13 + 1) {
      *(idx_t *)((long)&(peVar20->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                        internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + local_130) = local_190->byte_offset + local_b0;
      uVar25 = (ulong)local_148[iVar13];
      iVar23 = 0;
      if (uVar25 == 0) {
        iVar23 = *(int *)&pFVar17->_vptr_FileBuffer;
      }
      uVar24 = (ulong)(*(int *)&pFVar19->_vptr_FileBuffer * (uint)local_148[iVar13] + iVar23);
      uVar21 = 0;
      if (uVar25 == 0) {
        uVar21 = uVar24;
      }
      peVar20 = (element_type *)
                ((long)&(peVar20->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.
                        internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + local_c8);
      next_entry_sizes[iVar13] = uVar24;
      pFVar19 = (FileBuffer *)((long)&pFVar19->_vptr_FileBuffer + uVar25 * uVar24);
      pFVar17 = (FileBuffer *)((long)&pFVar17->_vptr_FileBuffer + uVar21);
      local_b0 = local_b0 + uVar24;
    }
    uVar25 = local_190->byte_offset + local_b0;
    iVar22 = local_128;
    pSVar11 = local_100;
    local_168 = peVar20;
    if (local_190->capacity < uVar25) {
      (*this->buffer_manager->_vptr_BufferManager[6])(this->buffer_manager,local_190,uVar25);
      pRVar27->capacity = uVar25;
      pdVar10 = BufferHandle::Ptr(&result_heap_handle);
      iVar22 = local_128;
      pSVar11 = (type)(pdVar10 + pRVar27->byte_offset);
    }
    for (; pFVar17 = local_110, pbVar8 = local_148, local_108 != iVar22; iVar22 = iVar22 + 1) {
      uVar25 = (ulong)local_148[iVar22] ^ 1;
      switchD_016b0717::default
                (pSVar11,(void *)((long)pFVar28 * uVar25 +
                                 (long)local_110 * (ulong)local_148[iVar22]),
                 next_entry_sizes[iVar22]);
      iVar26 = next_entry_sizes[iVar22];
      local_110 = (FileBuffer *)((long)&pFVar17->_vptr_FileBuffer + iVar26 * pbVar8[iVar22]);
      pFVar28 = (FileBuffer *)((long)&pFVar28->_vptr_FileBuffer + iVar26 * uVar25);
      *local_178 = *local_178 + (ulong)pbVar8[iVar22];
      *local_180 = *local_180 + uVar25;
      pSVar11 = (type)((long)&(((shared_ptr<duckdb::BlockHandle,_true> *)&pSVar11->buffer_manager)->
                              internal).
                              super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + iVar26);
      pRVar27 = local_190;
    }
    local_f8 = local_110;
    pRVar27->count = pRVar27->count + local_a8;
    pRVar27->byte_offset = pRVar27->byte_offset + local_b0;
    copied = local_108;
    sd = local_f0;
    local_100 = pSVar11;
    local_e0 = pFVar28;
  } while( true );
}

Assistant:

void MergeSorter::MergeData(SortedData &result_data, SortedData &l_data, SortedData &r_data, const idx_t &count,
                            const bool left_smaller[], idx_t next_entry_sizes[], bool reset_indices) {
	auto &l = *left;
	auto &r = *right;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;

	const auto &layout = result_data.layout;
	const idx_t row_width = layout.GetRowWidth();
	const idx_t heap_pointer_offset = layout.GetHeapOffset();

	// Left and right row data to merge
	data_ptr_t l_ptr;
	data_ptr_t r_ptr;
	// Accompanying left and right heap data (if needed)
	data_ptr_t l_heap_ptr;
	data_ptr_t r_heap_ptr;

	// Result rows to write to
	RowDataBlock *result_data_block = result_data.data_blocks.back().get();
	auto result_data_handle = buffer_manager.Pin(result_data_block->block);
	data_ptr_t result_data_ptr = result_data_handle.Ptr() + result_data_block->count * row_width;
	// Result heap to write to (if needed)
	RowDataBlock *result_heap_block = nullptr;
	BufferHandle result_heap_handle;
	data_ptr_t result_heap_ptr;
	if (!layout.AllConstant() && state.external) {
		result_heap_block = result_data.heap_blocks.back().get();
		result_heap_handle = buffer_manager.Pin(result_heap_block->block);
		result_heap_ptr = result_heap_handle.Ptr() + result_heap_block->byte_offset;
	}

	idx_t copied = 0;
	while (copied < count) {
		// Move to new data blocks (if needed)
		if (l.block_idx < l_data.data_blocks.size() && l.entry_idx == l_data.data_blocks[l.block_idx]->count) {
			// Delete reference to previous block
			l_data.data_blocks[l.block_idx]->block = nullptr;
			if (!layout.AllConstant() && state.external) {
				l_data.heap_blocks[l.block_idx]->block = nullptr;
			}
			// Advance block
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_data.data_blocks.size() && r.entry_idx == r_data.data_blocks[r.block_idx]->count) {
			// Delete reference to previous block
			r_data.data_blocks[r.block_idx]->block = nullptr;
			if (!layout.AllConstant() && state.external) {
				r_data.heap_blocks[r.block_idx]->block = nullptr;
			}
			// Advance block
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_data.data_blocks.size();
		const bool r_done = r.block_idx == r_data.data_blocks.size();
		// Pin the row data blocks
		if (!l_done) {
			l.PinData(l_data);
			l_ptr = l.DataPtr(l_data);
		}
		if (!r_done) {
			r.PinData(r_data);
			r_ptr = r.DataPtr(r_data);
		}
		const idx_t &l_count = !l_done ? l_data.data_blocks[l.block_idx]->count : 0;
		const idx_t &r_count = !r_done ? r_data.data_blocks[r.block_idx]->count : 0;
		// Perform the merge
		if (layout.AllConstant() || !state.external) {
			// If all constant size, or if we are doing an in-memory sort, we do not need to touch the heap
			if (!l_done && !r_done) {
				// Both sides have data - merge
				MergeRows(l_ptr, l.entry_idx, l_count, r_ptr, r.entry_idx, r_count, *result_data_block, result_data_ptr,
				          row_width, left_smaller, copied, count);
			} else if (r_done) {
				// Right side is exhausted
				FlushRows(l_ptr, l.entry_idx, l_count, *result_data_block, result_data_ptr, row_width, copied, count);
			} else {
				// Left side is exhausted
				FlushRows(r_ptr, r.entry_idx, r_count, *result_data_block, result_data_ptr, row_width, copied, count);
			}
		} else {
			// External sorting with variable size data. Pin the heap blocks too
			if (!l_done) {
				l_heap_ptr = l.BaseHeapPtr(l_data) + Load<idx_t>(l_ptr + heap_pointer_offset);
				D_ASSERT(l_heap_ptr - l.BaseHeapPtr(l_data) >= 0);
				D_ASSERT((idx_t)(l_heap_ptr - l.BaseHeapPtr(l_data)) < l_data.heap_blocks[l.block_idx]->byte_offset);
			}
			if (!r_done) {
				r_heap_ptr = r.BaseHeapPtr(r_data) + Load<idx_t>(r_ptr + heap_pointer_offset);
				D_ASSERT(r_heap_ptr - r.BaseHeapPtr(r_data) >= 0);
				D_ASSERT((idx_t)(r_heap_ptr - r.BaseHeapPtr(r_data)) < r_data.heap_blocks[r.block_idx]->byte_offset);
			}
			// Both the row and heap data need to be dealt with
			if (!l_done && !r_done) {
				// Both sides have data - merge
				idx_t l_idx_copy = l.entry_idx;
				idx_t r_idx_copy = r.entry_idx;
				data_ptr_t result_data_ptr_copy = result_data_ptr;
				idx_t copied_copy = copied;
				// Merge row data
				MergeRows(l_ptr, l_idx_copy, l_count, r_ptr, r_idx_copy, r_count, *result_data_block,
				          result_data_ptr_copy, row_width, left_smaller, copied_copy, count);
				const idx_t merged = copied_copy - copied;
				// Compute the entry sizes and number of heap bytes that will be copied
				idx_t copy_bytes = 0;
				data_ptr_t l_heap_ptr_copy = l_heap_ptr;
				data_ptr_t r_heap_ptr_copy = r_heap_ptr;
				for (idx_t i = 0; i < merged; i++) {
					// Store base heap offset in the row data
					Store<idx_t>(result_heap_block->byte_offset + copy_bytes, result_data_ptr + heap_pointer_offset);
					result_data_ptr += row_width;
					// Compute entry size and add to total
					const bool &l_smaller = left_smaller[copied + i];
					const bool r_smaller = !l_smaller;
					auto &entry_size = next_entry_sizes[copied + i];
					entry_size =
					    l_smaller * Load<uint32_t>(l_heap_ptr_copy) + r_smaller * Load<uint32_t>(r_heap_ptr_copy);
					D_ASSERT(entry_size >= sizeof(uint32_t));
					D_ASSERT(NumericCast<idx_t>(l_heap_ptr_copy - l.BaseHeapPtr(l_data)) + l_smaller * entry_size <=
					         l_data.heap_blocks[l.block_idx]->byte_offset);
					D_ASSERT(NumericCast<idx_t>(r_heap_ptr_copy - r.BaseHeapPtr(r_data)) + r_smaller * entry_size <=
					         r_data.heap_blocks[r.block_idx]->byte_offset);
					l_heap_ptr_copy += l_smaller * entry_size;
					r_heap_ptr_copy += r_smaller * entry_size;
					copy_bytes += entry_size;
				}
				// Reallocate result heap block size (if needed)
				if (result_heap_block->byte_offset + copy_bytes > result_heap_block->capacity) {
					idx_t new_capacity = result_heap_block->byte_offset + copy_bytes;
					buffer_manager.ReAllocate(result_heap_block->block, new_capacity);
					result_heap_block->capacity = new_capacity;
					result_heap_ptr = result_heap_handle.Ptr() + result_heap_block->byte_offset;
				}
				D_ASSERT(result_heap_block->byte_offset + copy_bytes <= result_heap_block->capacity);
				// Now copy the heap data
				for (idx_t i = 0; i < merged; i++) {
					const bool &l_smaller = left_smaller[copied + i];
					const bool r_smaller = !l_smaller;
					const auto &entry_size = next_entry_sizes[copied + i];
					memcpy(result_heap_ptr,
					       reinterpret_cast<data_ptr_t>(l_smaller * CastPointerToValue(l_heap_ptr) +
					                                    r_smaller * CastPointerToValue(r_heap_ptr)),
					       entry_size);
					D_ASSERT(Load<uint32_t>(result_heap_ptr) == entry_size);
					result_heap_ptr += entry_size;
					l_heap_ptr += l_smaller * entry_size;
					r_heap_ptr += r_smaller * entry_size;
					l.entry_idx += l_smaller;
					r.entry_idx += r_smaller;
				}
				// Update result indices and pointers
				result_heap_block->count += merged;
				result_heap_block->byte_offset += copy_bytes;
				copied += merged;
			} else if (r_done) {
				// Right side is exhausted - flush left
				FlushBlobs(layout, l_count, l_ptr, l.entry_idx, l_heap_ptr, *result_data_block, result_data_ptr,
				           *result_heap_block, result_heap_handle, result_heap_ptr, copied, count);
			} else {
				// Left side is exhausted - flush right
				FlushBlobs(layout, r_count, r_ptr, r.entry_idx, r_heap_ptr, *result_data_block, result_data_ptr,
				           *result_heap_block, result_heap_handle, result_heap_ptr, copied, count);
			}
			D_ASSERT(result_data_block->count == result_heap_block->count);
		}
	}
	if (reset_indices) {
		left->SetIndices(l_block_idx_before, l_entry_idx_before);
		right->SetIndices(r_block_idx_before, r_entry_idx_before);
	}
}